

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

void __thiscall ON_ClippingPlaneDataList::DeleteEntry(ON_ClippingPlaneDataList *this,uint sn)

{
  ON_ClippingPlaneData *this_00;
  int iVar1;
  ON_ClippingPlaneData **ppOVar2;
  ON_ClippingPlaneData *data;
  int i;
  int count;
  uint sn_local;
  ON_ClippingPlaneDataList *this_local;
  
  iVar1 = ON_SimpleArray<ON_ClippingPlaneData_*>::Count(&this->m_list);
  data._4_4_ = 0;
  while( true ) {
    if (iVar1 <= data._4_4_) {
      return;
    }
    ppOVar2 = ON_SimpleArray<ON_ClippingPlaneData_*>::operator[](&this->m_list,data._4_4_);
    this_00 = *ppOVar2;
    if ((this_00 != (ON_ClippingPlaneData *)0x0) && (this_00->m_sn == sn)) break;
    data._4_4_ = data._4_4_ + 1;
  }
  if (this_00 != (ON_ClippingPlaneData *)0x0) {
    ON_ClippingPlaneData::~ON_ClippingPlaneData(this_00);
    operator_delete(this_00,0x50);
  }
  ON_SimpleArray<ON_ClippingPlaneData_*>::Remove(&this->m_list,data._4_4_);
  return;
}

Assistant:

void ON_ClippingPlaneDataList::DeleteEntry(unsigned int sn)
{
  int count = m_list.Count();
  for (int i=0; i<count; i++)
  {
    ON_ClippingPlaneData* data = m_list[i];
    if (data && data->m_sn == sn)
    {
      delete data;
      m_list.Remove(i);
      return;
    }
  }
}